

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fFboTestCase.cpp
# Opt level: O0

void __thiscall deqp::gles3::Functional::FboTestCase::checkError(FboTestCase *this)

{
  deUint32 error;
  Error *this_00;
  char *message;
  Enum<int,_2UL> EVar1;
  GetNameFunc local_a0;
  int local_98;
  string local_90;
  allocator<char> local_59;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  deUint32 local_14;
  FboTestCase *pFStack_10;
  deUint32 err;
  FboTestCase *this_local;
  
  pFStack_10 = this;
  local_14 = sglr::ContextWrapper::glGetError(&this->super_ContextWrapper);
  if (local_14 != 0) {
    this_00 = (Error *)__cxa_allocate_exception(0x38);
    error = local_14;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"Got ",&local_59);
    EVar1 = glu::getErrorStr(local_14);
    local_a0 = EVar1.m_getName;
    local_98 = EVar1.m_value;
    tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_90,&local_a0);
    std::operator+(&local_38,&local_58,&local_90);
    message = (char *)std::__cxx11::string::c_str();
    glu::Error::Error(this_00,error,message,(char *)0x0,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fFboTestCase.cpp"
                      ,0x94);
    __cxa_throw(this_00,&glu::Error::typeinfo,glu::Error::~Error);
  }
  return;
}

Assistant:

void FboTestCase::checkError (void)
{
	deUint32 err = glGetError();
	if (err != GL_NO_ERROR)
		throw glu::Error((int)err, (string("Got ") + glu::getErrorStr(err).toString()).c_str(), DE_NULL, __FILE__, __LINE__);
}